

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::do_actual_learning<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *ec_seq)

{
  ostream *this;
  string *pmessage;
  long in_RDI;
  stringstream __msg_1;
  multi_ex *in_stack_00000180;
  stringstream __msg;
  example *label_example;
  int plineNumber;
  char *pfile;
  vw_exception *in_stack_fffffffffffffc60;
  multi_ex *in_stack_fffffffffffffc70;
  multi_learner *in_stack_fffffffffffffc78;
  cb_explore_adf *in_stack_fffffffffffffc80;
  multi_learner *in_stack_fffffffffffffc88;
  cb_explore_adf *in_stack_fffffffffffffc90;
  multi_learner *in_stack_fffffffffffffc98;
  cb_explore_adf *in_stack_fffffffffffffca0;
  multi_ex *in_stack_fffffffffffffcc0;
  multi_learner *in_stack_fffffffffffffcc8;
  cb_explore_adf *in_stack_fffffffffffffcd0;
  multi_ex *in_stack_fffffffffffffd20;
  multi_learner *in_stack_fffffffffffffd28;
  cb_explore_adf *in_stack_fffffffffffffd30;
  multi_ex *in_stack_fffffffffffffd80;
  multi_learner *in_stack_fffffffffffffd88;
  cb_explore_adf *in_stack_fffffffffffffd90;
  stringstream local_1b8 [16];
  ostream local_1a8;
  cb_class local_30;
  example *local_20;
  long local_8;
  
  local_8 = in_RDI;
  local_20 = test_adf_sequence(in_stack_00000180);
  local_30 = CB_ADF::get_observed_cost((multi_ex *)in_stack_fffffffffffffc90);
  *(undefined8 *)(local_8 + 0x118) = local_30._0_8_;
  *(undefined8 *)(local_8 + 0x120) = local_30._8_8_;
  if (local_20 != (example *)0x0) {
    *(label_t *)(local_8 + 0x170) = (local_20->l).multi;
    *(wclass **)(local_8 + 0x178) = (local_20->l).cs.costs._end;
    *(wclass **)(local_8 + 0x180) = (local_20->l).cs.costs.end_array;
    *(size_t *)(local_8 + 0x188) = (local_20->l).cs.costs.erase_count;
    (local_20->l).multi = *(label_t *)(local_8 + 400);
    (local_20->l).cs.costs._end = *(wclass **)(local_8 + 0x198);
    (local_20->l).cs.costs.end_array = *(wclass **)(local_8 + 0x1a0);
    (local_20->l).cs.costs.erase_count = *(size_t *)(local_8 + 0x1a8);
  }
  pfile = *(char **)(local_8 + 0x50);
  switch(pfile) {
  case (char *)0x0:
    predict_or_learn_first<false>
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    break;
  case (char *)0x1:
    predict_or_learn_greedy<false>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (multi_ex *)in_stack_fffffffffffffc80);
    break;
  case (char *)0x2:
    predict_or_learn_bag<false>
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    break;
  case (char *)0x3:
    predict_or_learn_softmax<false>
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (multi_ex *)in_stack_fffffffffffffc90);
    break;
  case (char *)0x4:
    predict_or_learn_cover<false>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    break;
  case (char *)0x5:
    predict_or_learn_regcb<false>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1b8);
    this = std::operator<<(&local_1a8,
                           "Unknown explorer type specified for contextual bandit learning: ");
    std::ostream::operator<<(this,*(ulong *)(local_8 + 0x50));
    plineNumber = (int)((ulong)this >> 0x20);
    pmessage = (string *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception(in_stack_fffffffffffffc60,pfile,plineNumber,pmessage);
    __cxa_throw(pmessage,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (local_20 != (example *)0x0) {
    (local_20->l).multi = *(label_t *)(local_8 + 0x170);
    (local_20->l).cs.costs._end = *(wclass **)(local_8 + 0x178);
    (local_20->l).cs.costs.end_array = *(wclass **)(local_8 + 0x180);
    (local_20->l).cs.costs.erase_count = *(size_t *)(local_8 + 0x188);
  }
  return;
}

Assistant:

void do_actual_learning(cb_explore_adf& data, multi_learner& base, multi_ex& ec_seq)
{
  example* label_example = test_adf_sequence(ec_seq);
  data.gen_cs.known_cost = CB_ADF::get_observed_cost(ec_seq);

  if (label_example == nullptr || !is_learn)
  {
    if (label_example != nullptr)  // extract label
    {
      data.action_label = label_example->l.cb;
      label_example->l.cb = data.empty_label;
    }
    switch (data.explore_type)
    {
      case EXPLORE_FIRST:
        predict_or_learn_first<false>(data, base, ec_seq);
        break;
      case EPS_GREEDY:
        predict_or_learn_greedy<false>(data, base, ec_seq);
        break;
      case SOFTMAX:
        predict_or_learn_softmax<false>(data, base, ec_seq);
        break;
      case BAG_EXPLORE:
        predict_or_learn_bag<false>(data, base, ec_seq);
        break;
      case COVER:
        predict_or_learn_cover<false>(data, base, ec_seq);
        break;
      case REGCB:
        predict_or_learn_regcb<false>(data, base, ec_seq);
        break;
      default:
        THROW("Unknown explorer type specified for contextual bandit learning: " << data.explore_type);
    }
    if (label_example != nullptr)  // restore label
      label_example->l.cb = data.action_label;
  }
  else
  {
    /*	v_array<float> temp_probs;
    temp_probs = v_init<float>();
    do_actual_learning<false>(data,base);
    for (size_t i = 0; i < data.ec_seq[0]->pred.a_s.size(); i++)
    temp_probs.push_back(data.ec_seq[0]->pred.a_s[i].score);*/

    switch (data.explore_type)
    {
      case EXPLORE_FIRST:
        predict_or_learn_first<is_learn>(data, base, ec_seq);
        break;
      case EPS_GREEDY:
        predict_or_learn_greedy<is_learn>(data, base, ec_seq);
        break;
      case SOFTMAX:
        predict_or_learn_softmax<is_learn>(data, base, ec_seq);
        break;
      case BAG_EXPLORE:
        predict_or_learn_bag<is_learn>(data, base, ec_seq);
        break;
      case COVER:
        predict_or_learn_cover<is_learn>(data, base, ec_seq);
        break;
      case REGCB:
        predict_or_learn_regcb<is_learn>(data, base, ec_seq);
        break;
      default:
        THROW("Unknown explorer type specified for contextual bandit learning: " << data.explore_type);
    }

  }
}